

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc.cpp
# Opt level: O0

MPP_RET rc_frm_check_drop(RcCtx ctx,EncRcTask *task)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  RK_S32 drop;
  RK_S32 rate_out;
  RK_S32 rate_in;
  RK_S32 frm_cnt;
  RcFpsCfg *cfg;
  MPP_RET ret;
  RcImplApi *api;
  MppRcImpl *p;
  EncRcTask *task_local;
  RcCtx ctx_local;
  
  lVar1 = *(long *)((long)ctx + 8);
  if ((rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc","enter %p\n","rc_frm_check_drop",ctx);
  }
  if ((((lVar1 == 0) || (*(long *)(lVar1 + 0x20) == 0)) || (*ctx == 0)) ||
     (task == (EncRcTask *)0x0)) {
    rate_out = *(int *)((long)ctx + 300);
    iVar3 = *(int *)((long)ctx + 0x118) * *(int *)((long)ctx + 0x128);
    iVar4 = *(int *)((long)ctx + 0x124) * *(int *)((long)ctx + 0x11c);
    if ((*(int *)((long)ctx + 0x11c) < 1) &&
       (_mpp_log_l(2,"rc","Assertion %s failed at %s:%d\n",(char *)0x0,"cfg->fps_in_denom >= 1",
                   "rc_frm_check_drop",0x98), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if ((*(int *)((long)ctx + 0x128) < 1) &&
       (_mpp_log_l(2,"rc","Assertion %s failed at %s:%d\n",(char *)0x0,"cfg->fps_out_denom >= 1",
                   "rc_frm_check_drop",0x99), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if ((iVar3 < iVar4) &&
       (_mpp_log_l(2,"rc","Assertion %s failed at %s:%d\n",(char *)0x0,"rate_in >= rate_out",
                   "rc_frm_check_drop",0x9a), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if (rate_out < 0) {
      rate_out = iVar3 - iVar4;
    }
    rate_out = iVar4 + rate_out;
    bVar2 = iVar3 <= rate_out;
    if (bVar2) {
      rate_out = rate_out - iVar3;
    }
    *(RK_S32 *)((long)ctx + 300) = rate_out;
    (task->frm).val = (task->frm).val & 0xfffffffeffffffff | (ulong)!bVar2 << 0x20;
    if ((rc_debug & 1) != 0) {
      _mpp_log_l(4,"rc","leave %p drop %d\n","rc_frm_check_drop",ctx,
                 (ulong)((uint)((task->frm).val >> 0x20) & 1));
    }
    ctx_local._4_4_ = MPP_OK;
  }
  else {
    ctx_local._4_4_ = (**(code **)(lVar1 + 0x20))(*ctx,task);
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET rc_frm_check_drop(RcCtx ctx, EncRcTask *task)
{
    MppRcImpl *p = (MppRcImpl *)ctx;
    const RcImplApi *api = p->api;
    MPP_RET ret = MPP_OK;

    rc_dbg_func("enter %p\n", ctx);

    if (api && api->check_drop && p->ctx && task) {
        ret = api->check_drop(p->ctx, task);
        return ret;
    } else {
        RcFpsCfg *cfg = &p->fps;
        RK_S32 frm_cnt  = p->frm_cnt;
        RK_S32 rate_in  = cfg->fps_in_num * cfg->fps_out_denom;
        RK_S32 rate_out = cfg->fps_out_num * cfg->fps_in_denom;
        RK_S32 drop = 0;

        mpp_assert(cfg->fps_in_denom >= 1);
        mpp_assert(cfg->fps_out_denom >= 1);
        mpp_assert(rate_in >= rate_out);

        // frame counter is inited to (rate_in - rate_out)  to encode first frame
        if (frm_cnt < 0)
            frm_cnt = rate_in - rate_out;

        frm_cnt += rate_out;

        if (frm_cnt < rate_in)
            drop = 1;
        else
            frm_cnt -= rate_in;

        p->frm_cnt = frm_cnt;
        task->frm.drop = drop;
    }

    rc_dbg_func("leave %p drop %d\n", ctx, task->frm.drop);

    return ret;
}